

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

int ON_BrepMergeFaces(ON_Brep *B,int fid0,int fid1)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int *piVar4;
  bool bVar5;
  ON_BrepLoop *loop;
  int iVar6;
  ON_BrepEdge *pOVar7;
  ON_BrepFace *pOVar8;
  ON_Surface *pOVar9;
  ON_BrepFace *pOVar10;
  long lVar11;
  uint uVar12;
  ON_BrepLoop *pOVar13;
  ON_BrepLoop *pOVar14;
  long lVar15;
  ON_BrepTrim *pOVar16;
  ON_BrepTrim *pOVar17;
  long lVar18;
  ON_BrepFace *pOVar19;
  ON_SimpleArray<int> new_tids;
  ulong local_60;
  ON_SimpleArray<int> local_48;
  
  if (fid0 < 0 || fid0 == fid1) {
    return -1;
  }
  uVar12 = (B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  if ((int)uVar12 <= fid0) {
    return -1;
  }
  if (uVar12 <= (uint)fid1) {
    return -1;
  }
  pOVar10 = (B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
  if ((pOVar10[(uint)fid0].m_face_index | fid1) < 0) {
    return -1;
  }
  if (pOVar10[(uint)fid1].m_face_index < 0) {
    return -1;
  }
  pOVar19 = pOVar10 + (uint)fid0;
  pOVar10 = pOVar10 + (uint)fid1;
  if (pOVar19->m_si != pOVar10->m_si) {
    return -1;
  }
  iVar6 = (pOVar19->m_li).m_count;
  if (iVar6 < 1) {
    return -1;
  }
  uVar12 = 0xffffffff;
  lVar15 = 0;
  local_60 = 0xffffffff;
  do {
    iVar1 = (pOVar19->m_li).m_a[lVar15];
    pOVar14 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    if (pOVar14[iVar1].m_ti.m_count < 1) {
      bVar5 = true;
    }
    else {
      lVar18 = 0;
      do {
        pOVar16 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a +
                  pOVar14[iVar1].m_ti.m_a[lVar18];
        pOVar7 = ON_BrepTrim::Edge(pOVar16);
        if ((pOVar7 != (ON_BrepEdge *)0x0) && ((pOVar7->m_ti).m_count == 2)) {
          uVar12 = pOVar16->m_trim_index;
          puVar3 = (uint *)(pOVar7->m_ti).m_a;
          uVar2 = puVar3[*puVar3 == uVar12];
          local_60 = (ulong)uVar2;
          if ((-1 < (int)uVar12) && (-1 < (int)uVar2)) {
            pOVar17 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                      m_a + local_60;
            iVar6 = ON_BrepTrim::FaceIndexOf(pOVar17);
            if (((iVar6 == fid1) && (pOVar16->m_bRev3d != pOVar17->m_bRev3d)) &&
               (pOVar16->m_iso == pOVar17->m_iso)) {
              bVar5 = false;
              goto LAB_00417cf6;
            }
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < pOVar14[iVar1].m_ti.m_count);
      bVar5 = true;
LAB_00417cf6:
      iVar6 = (pOVar19->m_li).m_count;
    }
    if ((!bVar5) || (lVar15 = lVar15 + 1, iVar6 <= lVar15)) {
      if (bVar5 || (int)uVar12 < 0) {
        return -1;
      }
      if ((int)local_60 < 0) {
        return -1;
      }
      pOVar16 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      lVar15 = (long)pOVar16[uVar12].m_li;
      if (lVar15 < 0) {
        return -1;
      }
      pOVar14 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      if (pOVar14[lVar15].m_loop_index < 0) {
        return -1;
      }
      pOVar14 = pOVar14 + lVar15;
      pOVar8 = ON_BrepLoop::Face(pOVar14);
      if (pOVar8 != pOVar19) {
        return -1;
      }
      lVar15 = (long)(pOVar14->m_ti).m_count;
      if (lVar15 < 1) {
        return -1;
      }
      pOVar17 = pOVar16 + local_60;
      lVar18 = 0;
      while ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
             [(pOVar14->m_ti).m_a[lVar18]].m_trim_index != uVar12) {
        lVar18 = lVar18 + 1;
        if (lVar15 == lVar18) {
          return -1;
        }
      }
      lVar15 = (long)pOVar17->m_li;
      if (lVar15 < 0) {
        return -1;
      }
      pOVar13 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      if (pOVar13[lVar15].m_loop_index < 0) {
        return -1;
      }
      pOVar13 = pOVar13 + lVar15;
      pOVar8 = ON_BrepLoop::Face(pOVar13);
      if (pOVar8 != pOVar10) {
        return -1;
      }
      lVar15 = (long)(pOVar13->m_ti).m_count;
      if (lVar15 < 1) {
        return -1;
      }
      lVar11 = 0;
      do {
        if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
            [(pOVar13->m_ti).m_a[lVar11]].m_trim_index == (int)local_60) {
          local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
          local_48.m_a = (int *)0x0;
          local_48.m_count = 0;
          local_48.m_capacity = 0;
          CreateNewTrimList(pOVar14,(int)lVar18,pOVar13,(int)lVar11,&local_48);
          loop = pOVar13;
          pOVar8 = pOVar19;
          if (pOVar13->m_type == inner) {
            fid0 = fid1;
            loop = pOVar14;
            pOVar14 = pOVar13;
            pOVar8 = pOVar10;
            pOVar10 = pOVar19;
          }
          ON_SimpleArray<int>::operator=(&pOVar14->m_ti,&local_48);
          ON_BoundingBox::Destroy(&pOVar14->m_pbox);
          if (-1 < (loop->m_ti).m_capacity) {
            (loop->m_ti).m_count = 0;
          }
          pOVar16[uVar12].m_li = -1;
          pOVar17->m_li = -1;
          ON_Brep::DeleteTrim(B,pOVar16 + uVar12,true);
          ON_Brep::DeleteTrim(B,pOVar17,true);
          ON_Brep::DeleteLoop(B,loop,true);
          lVar15 = (long)(pOVar14->m_ti).m_count;
          if (0 < lVar15) {
            iVar6 = pOVar14->m_loop_index;
            piVar4 = (pOVar14->m_ti).m_a;
            pOVar16 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                      m_a;
            lVar18 = 0;
            do {
              pOVar16[piVar4[lVar18]].m_li = iVar6;
              lVar18 = lVar18 + 1;
            } while (lVar15 != lVar18);
          }
          ON_Brep::MatchTrimEnds(B,pOVar14);
          if (0 < (pOVar10->m_li).m_count) {
            lVar15 = 0;
            do {
              iVar6 = (pOVar10->m_li).m_a[lVar15];
              pOVar14 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                        m_a;
              pOVar14[iVar6].m_fi = fid0;
              ON_SimpleArray<int>::Append(&pOVar8->m_li,&pOVar14[iVar6].m_loop_index);
              lVar15 = lVar15 + 1;
            } while (lVar15 < (pOVar10->m_li).m_count);
          }
          if (-1 < (pOVar10->m_li).m_capacity) {
            (pOVar10->m_li).m_count = 0;
          }
          ON_Brep::DeleteFace(B,pOVar10,true);
          pOVar9 = ON_BrepFace::SurfaceOf
                             ((B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                              super_ON_ClassArray<ON_BrepFace>.m_a + fid0);
          iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar9,0);
          if (((char)iVar6 != '\0') ||
             (iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar9,1)
             , (char)iVar6 != '\0')) {
            ON_Brep::SetTrimTypeFlags
                      (B,(B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>
                         .m_a + fid0,false);
          }
          ON_BrepRemoveSlits((B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                             super_ON_ClassArray<ON_BrepFace>.m_a + fid0);
          (*(B->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                    (B,(B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                       m_a + fid0,1);
          ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
          return fid0;
        }
        lVar11 = lVar11 + 1;
      } while (lVar15 != lVar11);
      return -1;
    }
  } while( true );
}

Assistant:

int ON_BrepMergeFaces(ON_Brep& B, int fid0, int fid1)

{
  if (fid0 == fid1)
    return -1;

  if (fid0 < 0 || fid0 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F0 = B.m_F[fid0];
  if (F0.m_face_index < 0)
    return -1;

  if (fid1 < 0 || fid1 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F1 = B.m_F[fid1];
  if (F1.m_face_index < 0)
    return -1;

  if (F0.m_si != F1.m_si)
    return -1;

  //Find a manifold edge that joins the two faces and combine the loops by removing 
  //the trims at that edge.

  ON_BrepEdge* pE = 0;

  int li;
  int tid0 = -1, tid1 = -1;
  for (li=0; li<F0.m_li.Count() && !pE; li++){
    ON_BrepLoop& L = B.m_L[F0.m_li[li]];
    int ti;
    for (ti=0; ti<L.m_ti.Count() && !pE; ti++){
      ON_BrepTrim& T0 = B.m_T[L.m_ti[ti]];
      ON_BrepEdge* pEE = T0.Edge();
      if (!pEE || pEE->m_ti.Count() != 2)
        continue;
      tid0 =T0.m_trim_index;
      tid1 = (pEE->m_ti[0] == tid0) ? pEE->m_ti[1] : pEE->m_ti[0];
      if (tid0 < 0 || tid1 < 0)
        continue;
      ON_BrepTrim& T1 = B.m_T[tid1];
      if (T1.FaceIndexOf() == fid1 && T0.m_bRev3d != T1.m_bRev3d 
        && T0.m_iso == T1.m_iso){//Don't combine across seams.
        pE = pEE;
        break;
      }
    }
  }

  if (!pE || tid0 < 0 || tid1 < 0)
    return -1;

  ON_BrepTrim& T0 = B.m_T[tid0];
  ON_BrepTrim& T1 = B.m_T[tid1];

  int lid0 = T0.m_li;
  if (lid0 < 0)
    return -1;
  ON_BrepLoop& L0 = B.m_L[lid0];
  if (L0.m_loop_index < 0)
    return -1;
  if (L0.Face() != &F0)
    return -1;
  int i;
  int ti0 = -1;
  for (i=0; i<L0.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L0.m_ti[i]];
    if (T.m_trim_index == tid0){
      ti0 = i;
      break;
    }
  }
  if (ti0 < 0)
    return -1;

  int lid1 = T1.m_li;
  if (lid1 < 0)
    return -1;
  ON_BrepLoop& L1 = B.m_L[lid1];
  if (L1.m_loop_index < 0)
    return -1;
  if (L1.Face() != &F1)
    return -1;
  int ti1 = -1;
  for (i=0; i<L1.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L1.m_ti[i]];
    if (T.m_trim_index == tid1){
      ti1 = i;
      break;
    }
  }
  if (ti1 < 0)
    return -1;


  ON_SimpleArray<int> new_tids;
  CreateNewTrimList(L0, ti0, L1, ti1, new_tids);

  ON_BrepLoop* pL;
  ON_BrepLoop* pD;
  ON_BrepFace* pF;
  ON_BrepFace* pDF;
  int rc;
  if (L1.m_type != ON_BrepLoop::inner){
    pL = &L0;
    pD = &L1;
    rc = fid0;
    pF = &F0;
    pDF = &F1;
  }
  else {
    pL = &L1;
    pD = &L0;
    rc = fid1;
    pF = &F1;
    pDF = &F0;
  }
  pL->m_ti = new_tids;
  pL->m_pbox.Destroy();
  pD->m_ti.SetCount(0);
  T0.m_li = -1;
  T1.m_li = -1;
  B.DeleteTrim(T0, true);
  B.DeleteTrim(T1, true);
  B.DeleteLoop(*pD, true);
  for (i=0; i<pL->m_ti.Count(); i++)
    B.m_T[pL->m_ti[i]].m_li = pL->m_loop_index;

  B.MatchTrimEnds(*pL);

  for (i=0; i<pDF->m_li.Count(); i++){
    ON_BrepLoop& ML = B.m_L[pDF->m_li[i]];
    ML.m_fi = rc;
    pF->m_li.Append(ML.m_loop_index);
  }
  pDF->m_li.SetCount(0);
  B.DeleteFace(*pDF, true);
  const ON_Surface* pSrf = B.m_F[rc].SurfaceOf();
  if (pSrf->IsClosed(0) || pSrf->IsClosed(1))
    B.SetTrimTypeFlags(B.m_F[rc]);//Some mateds may have become seams.
  ON_BrepRemoveSlits(B.m_F[rc]);

  B.SetTrimBoundingBoxes(B.m_F[rc], true);

  return rc;

}